

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPandVC.cpp
# Opt level: O0

void __thiscall Graph::printResult(Graph *this,uint rootOrder,uint pointOrder)

{
  ostream *poVar1;
  size_type sVar2;
  reference ppVVar3;
  reference pvVar4;
  undefined8 *puVar5;
  int local_54;
  int i_1;
  int theLastIndex;
  int local_3c;
  undefined1 local_38 [4];
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  V *Tmp;
  uint pointOrder_local;
  uint rootOrder_local;
  Graph *this_local;
  
  if (rootOrder == pointOrder) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rootOrder);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
    for (local_3c = 0; sVar2 = std::vector<V_*,_std::allocator<V_*>_>::size(&this->verticesVector),
        (ulong)(long)local_3c < sVar2; local_3c = local_3c + 1) {
      ppVVar3 = std::vector<V_*,_std::allocator<V_*>_>::operator[]
                          (&this->verticesVector,(long)local_3c);
      if (pointOrder == (*ppVVar3)->order) {
        ppVVar3 = std::vector<V_*,_std::allocator<V_*>_>::operator[]
                            (&this->verticesVector,(long)local_3c);
        result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = &(*ppVVar3)->order;
      }
    }
    for (; *(long *)(result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4) != 0;
        result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             *(pointer *)
              (result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 4)) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                 result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
               result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                        (long)((int)sVar2 + -1));
    if (*pvVar4 != rootOrder) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = "the path does not exsit.";
      __cxa_throw(puVar5,&char_const*::typeinfo,0);
    }
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
    local_54 = (int)sVar2;
    while (local_54 = local_54 + -1, 0 < local_54) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                          (long)local_54);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar4);
      std::operator<<(poVar1,'-');
    }
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
    if (sVar2 != 1) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,0);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar4);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  }
  return;
}

Assistant:

void Graph::printResult(unsigned rootOrder,unsigned pointOrder)
{
    
    if(rootOrder == pointOrder)
    {
        std::cout<< rootOrder << std::endl;
        return;
    }


    V *Tmp;
    std::vector<unsigned> result;
    for(int i = 0; i < this->verticesVector.size(); i++)
    {
        if(pointOrder == this->verticesVector[i]->order)
        {
            Tmp = this->verticesVector[i];
        }
    }
    
    while (Tmp->pParentVertex != NULL)
    {
        result.push_back(Tmp->order);
        Tmp = Tmp->pParentVertex;
    }
    result.push_back(Tmp->order);
    int theLastIndex = result.size()-1;
    if(result[theLastIndex]!=rootOrder)
    {
        throw "the path does not exsit.";
        return;
    }
    else
    {
        for(int i = result.size()-1; i > 0; i--)
        {
            std::cout << result[i] <<'-';
        }
        if(result.size()!=1)
        {
            std::cout << result[0] << std::endl;
        }
    }
}